

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::trainThread(FastText *this,int32_t threadId)

{
  element_type *peVar1;
  FastText *this_00;
  int64_t iVar2;
  vector<int,_std::allocator<int>_> *line_00;
  FastText *this_01;
  element_type *this_02;
  int64_t iVar3;
  vector<int,_std::allocator<int>_> *line_01;
  __int_type _Var4;
  int in_ESI;
  long in_RDI;
  real lr;
  real progress;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  int64_t localTokenCount;
  int64_t ntokens;
  State state;
  ifstream ifs;
  real in_stack_fffffffffffffccc;
  State *in_stack_fffffffffffffcd0;
  int32_t in_stack_fffffffffffffcd8;
  int32_t in_stack_fffffffffffffcdc;
  int32_t in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  undefined8 in_stack_fffffffffffffcf0;
  int32_t seed;
  int32_t in_stack_fffffffffffffcf8;
  int hiddenSize;
  State *state_00;
  minstd_rand *in_stack_fffffffffffffd38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd40;
  istream *in_stack_fffffffffffffd48;
  Dictionary *in_stack_fffffffffffffd50;
  istream *in_stack_fffffffffffffd58;
  Dictionary *in_stack_fffffffffffffd60;
  State *__i;
  State *in_stack_fffffffffffffd78;
  FastText *in_stack_fffffffffffffd80;
  State local_218 [5];
  int local_c;
  
  seed = (int32_t)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
  local_c = in_ESI;
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x187e98);
  state_00 = local_218;
  std::ifstream::ifstream(state_00,(string *)peVar1,_S_in);
  this_00 = (FastText *)(long)local_c;
  iVar2 = utils::size((ifstream *)in_stack_fffffffffffffcd0);
  line_00 = (vector<int,_std::allocator<int>_> *)((long)this_00 * iVar2);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x187eed);
  utils::seek((ifstream *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
              CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x187f1a);
  hiddenSize = peVar1->dim;
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x187f2f);
  this_01 = (FastText *)
            Matrix::size((Matrix *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                         (int64_t)in_stack_fffffffffffffcd0);
  Model::State::State((State *)this_01,hiddenSize,in_stack_fffffffffffffcf8,seed);
  this_02 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x187f71);
  iVar3 = Dictionary::ntokens(this_02);
  __i = (State *)0x0;
  iVar2 = iVar3;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x187fa6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x187fb0);
  while( true ) {
    line_01 = (vector<int,_std::allocator<int>_> *)
              std::__atomic_base::operator_cast_to_long
                        ((__atomic_base<long> *)
                         CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x187fcd);
    if (peVar1->epoch * iVar2 <= (long)line_01) break;
    _Var4 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    in_stack_fffffffffffffce4 = (float)_Var4;
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18800e);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18803a);
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18806d);
    if (peVar1->model == sup) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x188085);
      in_stack_fffffffffffffce0 =
           Dictionary::getLine(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd50,
                               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd48);
      in_stack_fffffffffffffcd0 =
           (State *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)&__i->lossValue_)->_M_impl)
                            .super__Vector_impl_data._M_start + (long)in_stack_fffffffffffffce0);
      supervised(this_01,(State *)CONCAT44(hiddenSize,in_stack_fffffffffffffcf8),
                 (real)((ulong)iVar3 >> 0x20),line_01,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    }
    else {
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18815a);
      if (peVar1->model == cbow) {
        std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x18816e);
        in_stack_fffffffffffffcdc =
             Dictionary::getLine(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                 in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
        in_stack_fffffffffffffcd0 =
             (State *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)&__i->lossValue_)->
                              _M_impl).super__Vector_impl_data._M_start +
                      (long)in_stack_fffffffffffffcdc);
        cbow(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(real)((ulong)iVar2 >> 0x20),
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcd0);
      }
      else {
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1881df);
        in_stack_fffffffffffffcd0 = __i;
        if (peVar1->model == sg) {
          std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1881f3);
          in_stack_fffffffffffffcd8 =
               Dictionary::getLine(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                   in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
          in_stack_fffffffffffffcd0 =
               (State *)((long)&(((_Vector_base<int,_std::allocator<int>_> *)&__i->lossValue_)->
                                _M_impl).super__Vector_impl_data._M_start +
                        (long)in_stack_fffffffffffffcd8);
          skipgram(this_00,state_00,(real)((ulong)in_RDI >> 0x20),line_00);
        }
      }
    }
    __i = in_stack_fffffffffffffcd0;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x188272);
    if ((long)peVar1->lrUpdateRate < (long)in_stack_fffffffffffffcd0) {
      std::__atomic_base<long>::operator+=((__atomic_base<long> *)(in_RDI + 0x50),(__int_type)__i);
      __i = (State *)0x0;
      if ((local_c == 0) &&
         (peVar1 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1882b9), 1 < peVar1->verbose)) {
        in_stack_fffffffffffffccc = Model::State::getLoss((State *)&stack0xfffffffffffffd78);
        std::atomic<float>::operator=
                  ((atomic<float> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      }
    }
  }
  if (local_c == 0) {
    Model::State::getLoss((State *)&stack0xfffffffffffffd78);
    std::atomic<float>::operator=
              ((atomic<float> *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
  }
  std::ifstream::close();
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  Model::State::~State(in_stack_fffffffffffffcd0);
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void FastText::trainThread(int32_t threadId) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  while (tokenCount_ < args_->epoch * ntokens) {
    real progress = real(tokenCount_) / (args_->epoch * ntokens);
    real lr = args_->lr * (1.0 - progress);
    if (args_->model == model_name::sup) {
      localTokenCount += dict_->getLine(ifs, line, labels);
      supervised(state, lr, line, labels);
    } else if (args_->model == model_name::cbow) {
      localTokenCount += dict_->getLine(ifs, line, state.rng);
      cbow(state, lr, line);
    } else if (args_->model == model_name::sg) {
      localTokenCount += dict_->getLine(ifs, line, state.rng);
      skipgram(state, lr, line);
    }
    if (localTokenCount > args_->lrUpdateRate) {
      tokenCount_ += localTokenCount;
      localTokenCount = 0;
      if (threadId == 0 && args_->verbose > 1)
        loss_ = state.getLoss();
    }
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}